

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O0

void __thiscall mocker::ast::ReturnStmt::~ReturnStmt(ReturnStmt *this)

{
  ReturnStmt *this_local;
  
  ~ReturnStmt(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit ReturnStmt(std::shared_ptr<Expression> expr)
      : expr(std::move(expr)) {}